

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

void dgrminer::printOutEdges
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list)

{
  ostream *poVar1;
  size_type sVar2;
  reference this;
  reference pvVar3;
  int local_1c;
  ulong uStack_18;
  int j;
  size_t i;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"PRINTING EDGE LIST - START");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uStack_18 = 0;
  while( true ) {
    sVar2 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                      (edge_list);
    if (sVar2 <= uStack_18) break;
    for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
      this = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator[]
                       (edge_list,uStack_18);
      pvVar3 = std::array<int,_10UL>::operator[](this,(long)local_1c);
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar3);
      std::operator<<(poVar1,", ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    uStack_18 = uStack_18 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"PRINTING EDGE LIST - START");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printOutEdges(std::vector<std::array<int, 10>> &edge_list)
    {

        std::cout << "PRINTING EDGE LIST - START" << std::endl;
        for (size_t i = 0; i < edge_list.size(); i++)
        {

            for (int j = 0; j < 10; j++)
            {
                std::cout << edge_list[i][j] << ", ";
            }
            std::cout << std::endl;
        }
        std::cout << "PRINTING EDGE LIST - START" << std::endl;
    }